

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O2

OPJ_BOOL opj_j2k_read_ppm(opj_j2k_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                         opj_event_mgr_t *p_manager)

{
  undefined1 *puVar1;
  uint uVar2;
  undefined8 in_RAX;
  opj_ppx *poVar3;
  OPJ_BYTE *pOVar4;
  char *fmt;
  uint uVar5;
  OPJ_UINT32 l_Z_ppm;
  
  l_Z_ppm = (OPJ_UINT32)((ulong)in_RAX >> 0x20);
  if (p_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0xed7,
                  "OPJ_BOOL opj_j2k_read_ppm(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0xed8,
                  "OPJ_BOOL opj_j2k_read_ppm(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_manager == (opj_event_mgr_t *)0x0) {
    __assert_fail("p_manager != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0xed9,
                  "OPJ_BOOL opj_j2k_read_ppm(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_header_size < 2) {
    fmt = "Error reading PPM marker\n";
    goto LAB_00115e3f;
  }
  puVar1 = &(p_j2k->m_cp).field_0x90;
  *puVar1 = *puVar1 | 1;
  opj_read_bytes_LE(p_header_data,&l_Z_ppm,1);
  poVar3 = (p_j2k->m_cp).ppm_markers;
  if (poVar3 == (opj_ppx *)0x0) {
    if ((p_j2k->m_cp).ppm_markers_count != 0) {
      __assert_fail("l_cp->ppm_markers_count == 0U",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                    ,0xeeb,
                    "OPJ_BOOL opj_j2k_read_ppm(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                   );
    }
    uVar5 = l_Z_ppm + 1;
    poVar3 = (opj_ppx *)opj_calloc((ulong)uVar5,0x10);
    (p_j2k->m_cp).ppm_markers = poVar3;
    if (poVar3 != (opj_ppx *)0x0) {
      (p_j2k->m_cp).ppm_markers_count = uVar5;
      goto LAB_00115dc6;
    }
  }
  else {
    if ((p_j2k->m_cp).ppm_markers_count <= l_Z_ppm) {
      uVar5 = l_Z_ppm + 1;
      poVar3 = (opj_ppx *)opj_realloc(poVar3,(ulong)uVar5 << 4);
      if (poVar3 == (opj_ppx *)0x0) goto LAB_00115e38;
      (p_j2k->m_cp).ppm_markers = poVar3;
      uVar2 = (p_j2k->m_cp).ppm_markers_count;
      memset(poVar3 + uVar2,0,(ulong)(uVar5 - uVar2) << 4);
      (p_j2k->m_cp).ppm_markers_count = uVar5;
      poVar3 = (p_j2k->m_cp).ppm_markers;
    }
LAB_00115dc6:
    if (poVar3[l_Z_ppm].m_data != (OPJ_BYTE *)0x0) {
      opj_event_msg(p_manager,1,"Zppm %u already read\n");
      return 0;
    }
    uVar5 = p_header_size - 1;
    pOVar4 = (OPJ_BYTE *)opj_malloc((ulong)uVar5);
    poVar3 = (p_j2k->m_cp).ppm_markers;
    poVar3[l_Z_ppm].m_data = pOVar4;
    if (pOVar4 != (OPJ_BYTE *)0x0) {
      poVar3[l_Z_ppm].m_data_size = uVar5;
      memcpy(poVar3[l_Z_ppm].m_data,p_header_data + 1,(ulong)uVar5);
      return 1;
    }
  }
LAB_00115e38:
  fmt = "Not enough memory to read PPM marker\n";
LAB_00115e3f:
  opj_event_msg(p_manager,1,fmt);
  return 0;
}

Assistant:

static OPJ_BOOL opj_j2k_read_ppm(
    opj_j2k_t *p_j2k,
    OPJ_BYTE * p_header_data,
    OPJ_UINT32 p_header_size,
    opj_event_mgr_t * p_manager)
{
    opj_cp_t *l_cp = 00;
    OPJ_UINT32 l_Z_ppm;

    /* preconditions */
    assert(p_header_data != 00);
    assert(p_j2k != 00);
    assert(p_manager != 00);

    /* We need to have the Z_ppm element + 1 byte of Nppm/Ippm at minimum */
    if (p_header_size < 2) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading PPM marker\n");
        return OPJ_FALSE;
    }

    l_cp = &(p_j2k->m_cp);
    l_cp->ppm = 1;

    opj_read_bytes(p_header_data, &l_Z_ppm, 1);             /* Z_ppm */
    ++p_header_data;
    --p_header_size;

    /* check allocation needed */
    if (l_cp->ppm_markers == NULL) { /* first PPM marker */
        OPJ_UINT32 l_newCount = l_Z_ppm + 1U; /* can't overflow, l_Z_ppm is UINT8 */
        assert(l_cp->ppm_markers_count == 0U);

        l_cp->ppm_markers = (opj_ppx *) opj_calloc(l_newCount, sizeof(opj_ppx));
        if (l_cp->ppm_markers == NULL) {
            opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to read PPM marker\n");
            return OPJ_FALSE;
        }
        l_cp->ppm_markers_count = l_newCount;
    } else if (l_cp->ppm_markers_count <= l_Z_ppm) {
        OPJ_UINT32 l_newCount = l_Z_ppm + 1U; /* can't overflow, l_Z_ppm is UINT8 */
        opj_ppx *new_ppm_markers;
        new_ppm_markers = (opj_ppx *) opj_realloc(l_cp->ppm_markers,
                          l_newCount * sizeof(opj_ppx));
        if (new_ppm_markers == NULL) {
            /* clean up to be done on l_cp destruction */
            opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to read PPM marker\n");
            return OPJ_FALSE;
        }
        l_cp->ppm_markers = new_ppm_markers;
        memset(l_cp->ppm_markers + l_cp->ppm_markers_count, 0,
               (l_newCount - l_cp->ppm_markers_count) * sizeof(opj_ppx));
        l_cp->ppm_markers_count = l_newCount;
    }

    if (l_cp->ppm_markers[l_Z_ppm].m_data != NULL) {
        /* clean up to be done on l_cp destruction */
        opj_event_msg(p_manager, EVT_ERROR, "Zppm %u already read\n", l_Z_ppm);
        return OPJ_FALSE;
    }

    l_cp->ppm_markers[l_Z_ppm].m_data = (OPJ_BYTE *) opj_malloc(p_header_size);
    if (l_cp->ppm_markers[l_Z_ppm].m_data == NULL) {
        /* clean up to be done on l_cp destruction */
        opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to read PPM marker\n");
        return OPJ_FALSE;
    }
    l_cp->ppm_markers[l_Z_ppm].m_data_size = p_header_size;
    memcpy(l_cp->ppm_markers[l_Z_ppm].m_data, p_header_data, p_header_size);

    return OPJ_TRUE;
}